

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void nn_process_option(nn_parse_context *ctx,int opt_index,char *argument)

{
  int *piVar1;
  nn_parse_context *pnVar2;
  nn_option *pnVar3;
  undefined8 *puVar4;
  int iVar5;
  undefined4 uVar6;
  FILE *__stream;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  char *__s;
  void *pvVar10;
  long lVar11;
  nn_parse_context *__size;
  char *pcVar12;
  nn_parse_context *ctx_00;
  bool bVar13;
  float fVar14;
  char *endptr;
  char *local_38;
  
  pnVar3 = ctx->options;
  if ((pnVar3[opt_index].conflicts_mask & ctx->mask) != 0) {
    nn_process_option_cold_1();
LAB_00104e33:
    nn_process_option_cold_4();
LAB_00104e3d:
    __assert_fail("data_len < data_buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                  ,0x1cc,"void nn_process_option(struct nn_parse_context *, int, char *)");
  }
  ctx->mask = ctx->mask | pnVar3[opt_index].mask_set;
  ctx_00 = ctx;
  switch(pnVar3[opt_index].type) {
  case NN_OPT_HELP:
    goto switchD_00104aca_caseD_0;
  case NN_OPT_INT:
    lVar11 = strtol(argument,&local_38,0);
    *(long *)((long)ctx->target + (long)pnVar3[opt_index].offset) = lVar11;
    if ((local_38 != argument) && (*local_38 == '\0')) {
      return;
    }
    pcVar12 = "requires integer argument";
    goto LAB_00104bab;
  case NN_OPT_INCREMENT:
    piVar1 = (int *)((long)ctx->target + (long)pnVar3[opt_index].offset);
    *piVar1 = *piVar1 + 1;
    break;
  case NN_OPT_DECREMENT:
    goto switchD_00104aca_caseD_3;
  case NN_OPT_ENUM:
    goto switchD_00104aca_caseD_4;
  case NN_OPT_SET_ENUM:
    uVar6 = *pnVar3[opt_index].pointer;
LAB_00104dd1:
    *(undefined4 *)((long)ctx->target + (long)pnVar3[opt_index].offset) = uVar6;
    break;
  case NN_OPT_STRING:
    *(char **)((long)ctx->target + (long)pnVar3[opt_index].offset) = argument;
    break;
  case NN_OPT_BLOB:
    pvVar7 = ctx->target;
    lVar11 = (long)pnVar3[opt_index].offset;
    *(char **)((long)pvVar7 + lVar11) = argument;
    sVar8 = strlen(argument);
    *(int *)((long)pvVar7 + lVar11 + 8) = (int)sVar8;
    *(undefined4 *)((long)pvVar7 + lVar11 + 0xc) = 0;
    break;
  case NN_OPT_FLOAT:
    fVar14 = strtof(argument,&local_38);
    *(float *)((long)ctx->target + (long)pnVar3[opt_index].offset) = fVar14;
    if ((local_38 != argument) && (*local_38 == '\0')) {
      return;
    }
    pcVar12 = "requires float point argument";
LAB_00104bab:
    nn_option_error(pcVar12,ctx,opt_index);
switchD_00104aca_caseD_4:
    pcVar12 = *pnVar3[opt_index].pointer;
    puVar4 = (undefined8 *)pnVar3[opt_index].pointer;
    while (pcVar12 != (char *)0x0) {
      iVar5 = strcmp(pcVar12,argument);
      if (iVar5 == 0) {
        uVar6 = *(undefined4 *)(puVar4 + 1);
        goto LAB_00104dd1;
      }
      pcVar12 = (char *)puVar4[2];
      puVar4 = puVar4 + 2;
    }
    nn_process_option_cold_7();
    goto switchD_00104aca_caseD_3;
  case NN_OPT_LIST_APPEND:
    nn_append_string(ctx,(nn_option *)(ulong)(uint)pnVar3[opt_index].offset,argument);
    return;
  case NN_OPT_LIST_APPEND_FMT:
    sVar8 = strlen(argument);
    pcVar12 = (char *)pnVar3[opt_index].pointer;
    sVar9 = strlen(pcVar12);
    ctx_00 = (nn_parse_context *)(sVar9 + sVar8);
    __s = (char *)malloc((size_t)ctx_00);
    iVar5 = snprintf(__s,(size_t)ctx_00,pcVar12,argument);
    if (ctx_00 <= (nn_parse_context *)(long)iVar5) goto LAB_00104e3d;
    nn_append_string(ctx,(nn_option *)(ulong)(uint)pnVar3[opt_index].offset,__s);
    lVar11 = (long)pnVar3[opt_index].offset;
    pvVar7 = ctx->target;
    if (*(long *)((long)pvVar7 + lVar11 + 8) == 0) {
      pvVar10 = malloc(8);
      *(undefined4 *)((long)pvVar7 + lVar11 + 0x14) = 1;
    }
    else {
      iVar5 = *(int *)((long)pvVar7 + lVar11 + 0x14);
      *(int *)((long)pvVar7 + lVar11 + 0x14) = iVar5 + 1;
      pvVar10 = realloc(*(void **)((long)pvVar7 + lVar11),(long)iVar5 * 8 + 8);
    }
    *(void **)((long)pvVar7 + lVar11 + 8) = pvVar10;
    if (*(long *)((long)pvVar7 + lVar11) != 0) {
      *(char **)((long)pvVar10 + (long)*(int *)((long)pvVar7 + lVar11 + 0x14) * 8 + -8) = __s;
      return;
    }
LAB_00104e66:
    nn_process_option_cold_6();
    goto LAB_00104e6e;
  case NN_OPT_READ_FILE:
    if (((*argument != '-') || (__stream = _stdin, argument[1] != '\0')) &&
       (__stream = fopen(argument,"r"), __stream == (FILE *)0x0)) {
      nn_process_option_cold_2();
LAB_00104e9c:
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                    ,499,"void nn_process_option(struct nn_parse_context *, int, char *)");
    }
    __size = (nn_parse_context *)0x1000;
    pvVar7 = malloc(0x1000);
    if (pvVar7 == (void *)0x0) {
      nn_process_option_cold_5();
      goto LAB_00104e66;
    }
    sVar8 = fread(pvVar7,1,0x1000,__stream);
    ctx_00 = (nn_parse_context *)(long)(int)sVar8;
    iVar5 = feof(__stream);
    if (iVar5 == 0) {
      __size = (nn_parse_context *)0x1000;
      do {
        sVar8 = (long)__size - (long)ctx_00;
        if (sVar8 < 0x400) {
          pnVar2 = (nn_parse_context *)((long)__size * 2);
          bVar13 = __size < &Elf64_Ehdr_00100000;
          __size = (nn_parse_context *)&__size[0x2e8b].args_left;
          if (bVar13) {
            __size = pnVar2;
          }
          pvVar7 = realloc(pvVar7,(size_t)__size);
          if (pvVar7 == (void *)0x0) goto LAB_00104e33;
          sVar8 = (long)__size - (long)ctx_00;
        }
        sVar8 = fread((void *)((long)pvVar7 + (long)ctx_00),1,sVar8,__stream);
        ctx_00 = (nn_parse_context *)((long)&ctx_00->def + (long)(int)sVar8);
        iVar5 = feof(__stream);
      } while (iVar5 == 0);
    }
    if ((ctx_00 != __size) && (pvVar7 = realloc(pvVar7,(size_t)ctx_00), pvVar7 == (void *)0x0))
    goto LAB_00104e9c;
    iVar5 = ferror(__stream);
    if (iVar5 == 0) {
      if (__stream != _stdin) {
        fclose(__stream);
      }
      pvVar10 = ctx->target;
      lVar11 = (long)pnVar3[opt_index].offset;
      *(void **)((long)pvVar10 + lVar11) = pvVar7;
      *(int *)((long)pvVar10 + lVar11 + 8) = (int)ctx_00;
      *(undefined4 *)((long)pvVar10 + lVar11 + 0xc) = 1;
      return;
    }
LAB_00104e6e:
    nn_process_option_cold_3();
switchD_00104aca_caseD_0:
    nn_print_help(ctx_00,_stdout);
    exit(0);
  default:
    abort();
  }
  return;
switchD_00104aca_caseD_3:
  piVar1 = (int *)((long)ctx->target + (long)pnVar3[opt_index].offset);
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

static void nn_process_option (struct nn_parse_context *ctx,
                              int opt_index, char *argument)
{
    struct nn_option *opt;
    struct nn_enum_item *items;
    char *endptr;
    struct nn_blob *blob;
    FILE *file;
    char *data;
    size_t data_len;
    size_t data_buf;
    int bytes_read;

    opt = &ctx->options[opt_index];
    if (ctx->mask & opt->conflicts_mask) {
        nn_option_conflict (ctx, opt_index);
    }
    ctx->mask |= opt->mask_set;

    switch (opt->type) {
        case NN_OPT_HELP:
            nn_print_help (ctx, stdout);
            exit (0);
            return;
        case NN_OPT_INT:
            *(long *)(((char *)ctx->target) + opt->offset) = strtol (argument,
                &endptr, 0);
            if (endptr == argument || *endptr != 0) {
                nn_option_error ("requires integer argument",
                                ctx, opt_index);
            }
            return;
        case NN_OPT_INCREMENT:
            *(int *)(((char *)ctx->target) + opt->offset) += 1;
            return;
        case NN_OPT_DECREMENT:
            *(int *)(((char *)ctx->target) + opt->offset) -= 1;
            return;
        case NN_OPT_ENUM:
            items = (struct nn_enum_item *)opt->pointer;
            for (;items->name; ++items) {
                if (!strcmp (items->name, argument)) {
                    *(int *)(((char *)ctx->target) + opt->offset) = \
                        items->value;
                    return;
                }
            }
            nn_invalid_enum_value (ctx, opt_index, argument);
            return;
        case NN_OPT_SET_ENUM:
            *(int *)(((char *)ctx->target) + opt->offset) = \
                *(int *)(opt->pointer);
            return;
        case NN_OPT_STRING:
            *(char **)(((char *)ctx->target) + opt->offset) = argument;
            return;
        case NN_OPT_BLOB:
            blob = (struct nn_blob *)(((char *)ctx->target) + opt->offset);
            blob->data = argument;
            blob->length = strlen (argument);
            blob->need_free = 0;
            return;
        case NN_OPT_FLOAT:
#if defined NN_HAVE_WINDOWS
            *(float *)(((char *)ctx->target) + opt->offset) =
                (float) atof (argument);
#else
            *(float *)(((char *)ctx->target) + opt->offset) =
                strtof (argument, &endptr);
            if (endptr == argument || *endptr != 0) {
                nn_option_error ("requires float point argument",
                                ctx, opt_index);
            }
#endif
            return;
        case NN_OPT_LIST_APPEND:
            nn_append_string (ctx, opt, argument);
            return;
        case NN_OPT_LIST_APPEND_FMT:
            data_buf = strlen (argument) + strlen (opt->pointer);
            data = malloc (data_buf);
#if defined NN_HAVE_WINDOWS
            data_len = _snprintf_s (data, data_buf, _TRUNCATE, opt->pointer,
                argument);
#else
            data_len = snprintf (data, data_buf, opt->pointer, argument);
#endif
            assert (data_len < data_buf);
            nn_append_string (ctx, opt, data);
            nn_append_string_to_free (ctx, opt, data);
            return;
        case NN_OPT_READ_FILE:
            if (!strcmp (argument, "-")) {
                file = stdin;
            } else {
                file = fopen (argument, "r");
                if (!file) {
                    fprintf (stderr, "Error opening file ``%s'': %s\n",
                        argument, strerror (errno));
                    exit (2);
                }
            }
            data = malloc (4096);
            if (!data)
                nn_memory_error (ctx);
            data_len = 0;
            data_buf = 4096;
            for (;;) {
                bytes_read = fread (data + data_len, 1, data_buf - data_len,
                                   file);
                data_len += bytes_read;
                if (feof (file))
                    break;
                if (data_buf - data_len < 1024) {
                    if (data_buf < (1 << 20)) {
                        data_buf *= 2;  /* grow twice until not too big */
                    } else {
                        data_buf += 1 << 20;  /* grow 1 Mb each time */
                    }
                    data = realloc (data, data_buf);
                    if (!data)
                        nn_memory_error (ctx);
                }
            }
            if (data_len != data_buf) {
                data = realloc (data, data_len);
                assert (data);
            }
            if (ferror (file)) {
#if defined _MSC_VER
#pragma warning (push)
#pragma warning (disable:4996)
#endif
                fprintf (stderr, "Error reading file ``%s'': %s\n",
                    argument, strerror (errno));
#if defined _MSC_VER
#pragma warning (pop)
#endif
                exit (2);
            }
            if (file != stdin) {
                fclose (file);
            }
            blob = (struct nn_blob *)(((char *)ctx->target) + opt->offset);
            blob->data = data;
            blob->length = data_len;
            blob->need_free = 1;
            return;
    }
    abort ();
}